

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNaiveState::WindowNaiveState
          (WindowNaiveState *this,WindowNaiveAggregator *aggregator_p)

{
  vector<unsigned_char,_true> *this_00;
  Vector *this_01;
  DataChunk *this_02;
  data_ptr_t pdVar1;
  Allocator *allocator;
  idx_t i;
  long lVar2;
  pointer puVar3;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f1;
  SubFrames *local_f0;
  DataChunk *local_e8;
  Vector *local_e0;
  DataChunk *local_d8;
  Vector *local_d0;
  vector<unsigned_char,_true> *local_c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  WindowAggregatorLocalState::WindowAggregatorLocalState(&this->super_WindowAggregatorLocalState);
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowNaiveState_0279dc58;
  this->aggregator = aggregator_p;
  this_00 = &this->state;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (aggregator_p->super_WindowAggregator).state_size << 0xb,(allocator_type *)&local_c0);
  local_c8 = this_00;
  LogicalType::LogicalType(&local_48,POINTER);
  this_01 = &this->statef;
  Vector::Vector(this_01,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_60,POINTER);
  Vector::Vector(&this->statep,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  local_d0 = &this->statep;
  DataChunk::DataChunk(&this->leaves);
  local_f0 = &this->frames;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->update_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->flush_count = 0;
  (this->update_sel).sel_vector = (sel_t *)0x0;
  (this->update_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = &this->leaves;
  LogicalType::LogicalType(&local_78,UBIGINT);
  Vector::Vector(&this->hashes,&local_78,0x800);
  local_e0 = &this->hashes;
  LogicalType::~LogicalType(&local_78);
  local_e8 = &this->orderby_sort;
  (this->comparer).
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->arg_orderer).
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  DataChunk::DataChunk(local_e8);
  this_02 = &this->orderby_payload;
  DataChunk::DataChunk(this_02);
  (this->orderby_sel).sel_vector = (sel_t *)0x0;
  (this->orderby_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->orderby_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  RowLayout::RowLayout(&this->payload_layout);
  WindowAggregatorLocalState::InitSubFrames
            (local_f0,(this->aggregator->super_WindowAggregator).exclude_mode);
  SelectionVector::Initialize(&this->update_sel,0x800);
  puVar3 = (this_00->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  Vector::SetVectorType(this_01,CONSTANT_VECTOR);
  Vector::Flatten(this_01,0x800);
  pdVar1 = (this->statef).data;
  for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 1) {
    *(pointer *)(pdVar1 + lVar2 * 8) = puVar3;
    puVar3 = puVar3 + (this->aggregator->super_WindowAggregator).state_size;
  }
  if (((this->aggregator->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->aggregator->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((this->arg_orderer).
      super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
      super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0)) {
    allocator = Allocator::DefaultAllocator();
    LogicalType::LogicalType(&local_90,UBIGINT);
    __l._M_len = 1;
    __l._M_array = &local_90;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_c0,__l,&local_f1);
    DataChunk::Initialize(this_02,allocator,(vector<duckdb::LogicalType,_true> *)&local_c0,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_c0);
    LogicalType::~LogicalType(&local_90);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_a8,this_02);
    RowLayout::Initialize(&this->payload_layout,(vector<duckdb::LogicalType,_true> *)&local_a8,true)
    ;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
    SelectionVector::Initialize(&this->orderby_sel,0x800);
  }
  return;
}

Assistant:

WindowNaiveState::WindowNaiveState(const WindowNaiveAggregator &aggregator_p)
    : aggregator(aggregator_p), state(aggregator.state_size * STANDARD_VECTOR_SIZE), statef(LogicalType::POINTER),
      statep((LogicalType::POINTER)), flush_count(0), hashes(LogicalType::HASH) {
	InitSubFrames(frames, aggregator.exclude_mode);

	update_sel.Initialize();

	//	Build the finalise vector that just points to the result states
	data_ptr_t state_ptr = state.data();
	D_ASSERT(statef.GetVectorType() == VectorType::FLAT_VECTOR);
	statef.SetVectorType(VectorType::CONSTANT_VECTOR);
	statef.Flatten(STANDARD_VECTOR_SIZE);
	auto fdata = FlatVector::GetData<data_ptr_t>(statef);
	for (idx_t i = 0; i < STANDARD_VECTOR_SIZE; ++i) {
		fdata[i] = state_ptr;
		state_ptr += aggregator.state_size;
	}

	//	Initialise any ORDER BY data
	if (!aggregator.arg_order_idx.empty() && !arg_orderer) {
		orderby_payload.Initialize(Allocator::DefaultAllocator(), {LogicalType::UBIGINT});
		payload_layout.Initialize(orderby_payload.GetTypes());
		orderby_sel.Initialize();
	}
}